

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

StatelessGenerator<std::array<bool,_5UL>_> cppqc::arrayOf<bool,5ul>(StatelessGenerator<bool> *g)

{
  __uniq_ptr_impl<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>_>_>
  in_RDI;
  StatelessGenerator<bool> *in_stack_ffffffffffffffb8;
  ArrayOfStatelessGenerator<bool,_5UL> *in_stack_ffffffffffffffd8;
  StatelessGenerator<std::array<bool,_5UL>_> *in_stack_ffffffffffffffe0;
  
  detail::ArrayOfStatelessGenerator<bool,_5UL>::ArrayOfStatelessGenerator
            ((ArrayOfStatelessGenerator<bool,_5UL> *)
             in_RDI._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>_>_>
             .
             super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>_*,_false>
             ._M_head_impl,in_stack_ffffffffffffffb8);
  StatelessGenerator<std::array<bool,5ul>>::
  StatelessGenerator<cppqc::detail::ArrayOfStatelessGenerator<bool,5ul>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  detail::ArrayOfStatelessGenerator<bool,_5UL>::~ArrayOfStatelessGenerator
            ((ArrayOfStatelessGenerator<bool,_5UL> *)0x13873a);
  return (unique_ptr<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>_>_>
          )(unique_ptr<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>_>_>
            )in_RDI._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>_>_>
             .
             super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<std::array<bool,_5UL>_>_*,_false>
             ._M_head_impl;
}

Assistant:

StatelessGenerator<std::array<T, N>> arrayOf(
    const StatelessGenerator<T>& g = Arbitrary<T>()) {
  return detail::ArrayOfStatelessGenerator<T, N>(g);
}